

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSClassID JS_NewClassID(JSClassID *pclass_id)

{
  JSClassID JVar1;
  JSClassID JVar2;
  
  JVar1 = js_class_id_alloc;
  if (*pclass_id != 0) {
    return *pclass_id;
  }
  JVar2 = js_class_id_alloc + 1;
  *pclass_id = js_class_id_alloc;
  js_class_id_alloc = JVar2;
  return JVar1;
}

Assistant:

JSClassID JS_NewClassID(JSClassID *pclass_id)
{
    JSClassID class_id;
    /* XXX: make it thread safe */
    class_id = *pclass_id;
    if (class_id == 0) {
        class_id = js_class_id_alloc++;
        *pclass_id = class_id;
    }
    return class_id;
}